

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void string64_suite::fail_missing_length_six(void)

{
  value_type input [3];
  decoder decoder;
  uchar local_3c [4];
  undefined4 local_38;
  value local_34;
  decoder local_30;
  
  local_3c[2] = '\0';
  local_3c[0] = 0xd9;
  local_3c[1] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            (&local_30,(uchar (*) [3])local_3c);
  local_34 = local_30.current.code;
  local_38 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x520,"void string64_suite::fail_missing_length_six()",&local_34,&local_38);
  return;
}

Assistant:

void fail_missing_length_six()
{
    const value_type input[] = { token::code::string64, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}